

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::HttpEntityBodyReader::doneReading(HttpEntityBodyReader *this)

{
  HttpInputStreamImpl *this_00;
  HttpInputStreamImpl *inner;
  HttpEntityBodyReader *this_local;
  
  this_00 = getInner(this);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::unsetCurrentWrapper
            (&this_00->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>,
             &this->weakInner);
  this->finished = true;
  HttpInputStreamImpl::finishRead(this_00);
  return;
}

Assistant:

void doneReading() {
    auto& inner = getInner();
    inner.unsetCurrentWrapper(weakInner);
    finished = true;
    inner.finishRead();
  }